

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinEPC17_1>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  uint in_EAX;
  uint uVar1;
  long lVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      auVar9 = *(undefined1 (*) [16])((long)rho + lVar2 * 2);
      dVar5 = 0.0;
      if (1e-24 < auVar9._8_8_ + auVar9._0_8_) {
        auVar9 = maxpd(_DAT_0101f3a0,auVar9);
        dVar10 = auVar9._8_8_;
        dVar8 = auVar9._0_8_;
        dVar4 = dVar8 + dVar10;
        dVar6 = 1.0 / dVar4;
        dVar5 = (dVar8 - dVar10) * dVar6;
        auVar9._8_8_ = -(ulong)(dVar6 * (dVar10 + dVar10) <= 1e-15);
        auVar9._0_8_ = -(ulong)(dVar6 * (dVar8 + dVar8) <= 1e-15);
        uVar1 = movmskpd(in_EAX,auVar9);
        dVar6 = 1.9999999999999991;
        if ((uVar1 & 2) == 0) {
          dVar6 = dVar5 + 1.0;
        }
        bVar3 = (uVar1 & 1) == 0;
        dVar7 = 9.992007221626409e-16;
        if (bVar3) {
          dVar7 = dVar6;
        }
        dVar6 = 1.9999999999999991;
        if (bVar3) {
          dVar6 = 1.0 - dVar5;
        }
        dVar11 = 9.992007221626409e-16;
        if ((uVar1 & 2) == 0) {
          dVar11 = dVar6;
        }
        dVar6 = dVar4 * dVar4 * dVar7 * dVar11;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        in_EAX = -(uint)(dVar10 <= 1e-24 && dVar8 <= 1e-24);
        dVar5 = 0.0;
        if ((in_EAX & 1) == 0) {
          dVar5 = (-1.0 / ((2.35 - dVar6 * 2.4 * 0.5) + dVar4 * dVar4 * dVar11 * dVar7 * 3.2 * 0.25)
                  ) * dVar11 * dVar4 * dVar7 * 0.25;
        }
      }
      *(double *)((long)eps + lVar2) = dVar5 * scal_fact + *(double *)((long)eps + lVar2);
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}